

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O3

void linker_mapfile(GlobalVars *gv)

{
  node *pnVar1;
  node *pnVar2;
  int iVar3;
  bool bVar4;
  node *pnVar5;
  node *pnVar6;
  FILE *__s;
  size_t __size;
  char *__ptr;
  node *pnVar7;
  undefined8 uVar8;
  
  if ((FILE *)gv->map_file != (FILE *)0x0) {
    fwrite("\nFiles:\n",8,1,(FILE *)gv->map_file);
    pnVar1 = (gv->selobjects).first;
    pnVar6 = pnVar1->next;
    while (pnVar6 != (node *)0x0) {
      if (-1 < *(short *)&pnVar1[8].next) {
        pnVar6 = pnVar1[1].next;
        if (*(char *)((long)&pnVar6[3].pred + 1) == '\b') {
          fprintf((FILE *)gv->map_file,"  %s (%s):",pnVar6[1].next,pnVar1[1].pred);
        }
        else {
          fprintf((FILE *)gv->map_file,"  %s:",pnVar1[1].pred);
        }
        if (*(char *)((long)&pnVar6[3].pred + 1) == '\x04') {
LAB_0010d689:
          __s = (FILE *)gv->map_file;
          __size = 0xf;
          __ptr = "  symbols only\n";
        }
        else {
          pnVar6 = (gv->lnksec).first;
          pnVar2 = pnVar6->next;
          if (pnVar2 == (node *)0x0) goto LAB_0010d689;
          uVar8 = 0x20;
          do {
            pnVar5 = pnVar2;
            pnVar2 = (pnVar6[6].pred)->next;
            pnVar7 = pnVar6[6].pred;
            if (pnVar2 != (node *)0x0) {
              do {
                pnVar5 = pnVar2;
                if (pnVar7[1].next == pnVar1) {
                  pnVar2 = pnVar7[2].next;
                  iVar3 = strcmp((char *)pnVar2,gv->common_sec_name);
                  if ((iVar3 != 0) &&
                     (iVar3 = strcmp((char *)pnVar2,gv->scommon_sec_name), iVar3 != 0)) {
                    fprintf((FILE *)gv->map_file,"%c %s %lx(%lx)",uVar8,pnVar2,pnVar7[3].pred,
                            pnVar7[5].next);
                    pnVar5 = pnVar7->next;
                    uVar8 = 0x2c;
                  }
                }
                pnVar2 = pnVar5->next;
                pnVar7 = pnVar5;
              } while (pnVar5->next != (node *)0x0);
              pnVar5 = pnVar6->next;
            }
            pnVar2 = pnVar5->next;
            pnVar6 = pnVar5;
          } while (pnVar5->next != (node *)0x0);
          if ((char)uVar8 != ',') goto LAB_0010d689;
          __s = (FILE *)gv->map_file;
          __size = 5;
          __ptr = " hex\n";
        }
        fwrite(__ptr,__size,1,__s);
      }
      pnVar1 = pnVar1->next;
      pnVar6 = pnVar1->next;
    }
    fwrite("\n\nSection mapping (numbers in hex):\n",0x24,1,(FILE *)gv->map_file);
    pnVar1 = (gv->lnksec).first;
    pnVar6 = pnVar1->next;
    while (pnVar6 != (node *)0x0) {
      if ((((pnVar1[5].next != (node *)0x0) || ((pnVar1[8].pred)->next != (node *)0x0)) ||
          ((pnVar1[0xb].pred)->next != (node *)0x0)) || (((ulong)pnVar1[2].pred & 2) != 0)) {
        fprintf((FILE *)gv->map_file,"------------------------------\n  %08lx %s  (size %lx",
                pnVar1[4].next,pnVar1[1].pred);
        if (pnVar1[5].pred < pnVar1[5].next) {
          fprintf((FILE *)gv->map_file,", allocated %lx");
        }
        fwrite(")\n",2,1,(FILE *)gv->map_file);
        for (pnVar6 = pnVar1[6].pred; pnVar6->next != (node *)0x0; pnVar6 = pnVar6->next) {
          if (((ObjectUnit *)pnVar6[1].next != (ObjectUnit *)0x0) &&
             (bVar4 = is_ld_script((ObjectUnit *)pnVar6[1].next), bVar4 == 0)) {
            fprintf((FILE *)gv->map_file,"           %08lx - %08lx %s(%s)\n",pnVar6[3].pred,
                    (long)&(pnVar6[3].pred)->next + (long)pnVar6[5].next,pnVar6[1].next[1].pred,
                    pnVar6[2].next);
          }
        }
      }
      pnVar1 = pnVar1->next;
      pnVar6 = pnVar1->next;
    }
  }
  return;
}

Assistant:

void linker_mapfile(struct GlobalVars *gv)
/* print section mapping, when desired */
{
  if (gv->map_file) {
    struct ObjectUnit *obj;
    struct Section *sec;
    struct LinkedSection *ls;

    /* print file names and the new addresses of their sections */
    fprintf(gv->map_file,"\nFiles:\n");

    for (obj=(struct ObjectUnit *)gv->selobjects.first;
         obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {
      struct LinkFile *lfile = obj->lnkfile;
      char sep = ' ';

      if (!(obj->flags & OUF_SCRIPT)) {
        if (lfile->type == ID_LIBARCH)
          fprintf(gv->map_file,"  %s (%s):",lfile->pathname,obj->objname);
        else
          fprintf(gv->map_file,"  %s:",obj->objname);

        if (lfile->type != ID_SHAREDOBJ) {
          for (ls=(struct LinkedSection *)gv->lnksec.first;
               ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
            for (sec=(struct Section *)ls->sections.first;
                 sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
              if (sec->obj == obj) {  /* section came from this object? */
                if (strcmp(sec->name,gv->common_sec_name) &&
                    strcmp(sec->name,gv->scommon_sec_name)) {
                  fprintf(gv->map_file,"%c %s %lx(%lx)",sep,sec->name,
                          sec->va,sec->size);
                  sep = ',';
                }
              }
            }
          }
        }

        if (sep == ',')  /* any sections listed? */
          fprintf(gv->map_file," hex\n");
        else
          fprintf(gv->map_file,"  symbols only\n"); /* empty or shared obj. */
      }
    }

    /* print section mappings */
    fprintf(gv->map_file,"\n\nSection mapping (numbers in hex):\n");

    for (ls=(struct LinkedSection *)gv->lnksec.first;
         ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
      if (!(ls->size==0 && listempty(&ls->relocs) &&
            listempty(&ls->symbols) && !(ls->ld_flags & LSF_PRESERVE))) {
        fprintf(gv->map_file,"------------------------------\n"
                "  %08lx %s  (size %lx",ls->copybase,ls->name,ls->size);
        if (ls->filesize < ls->size)
          fprintf(gv->map_file,", allocated %lx",ls->filesize);
        fprintf(gv->map_file,")\n");
  
        for (sec=(struct Section *)ls->sections.first;
             sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
          if (sec->obj!=NULL && !is_ld_script(sec->obj)) {
            fprintf(gv->map_file,"           %08lx - %08lx %s(%s)\n",
                    sec->va,sec->va+sec->size,sec->obj->objname,sec->name);
          }
        }
      }
    }
  }
}